

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O3

void __thiscall FDynamicColormap::BuildLights(FDynamicColormap *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  BYTE *pBVar4;
  BYTE BVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  PalEntry colors [256];
  PalEntry basecolors [256];
  long local_850;
  PalEntry local_838 [256];
  PalEntry local_438 [258];
  
  if (this->Maps != (BYTE *)0x0) {
    bVar1 = (this->Color).field_0.field_0.r;
    bVar2 = (this->Color).field_0.field_0.g;
    uVar3 = (this->Color).field_0.d;
    iVar12 = (this->Desaturate << 8) / 0xff;
    iVar11 = -iVar12;
    if (-1 < this->Desaturate) {
      iVar11 = iVar12;
    }
    if (iVar11 == 0) {
      memcpy(local_838 + 0x100,&GPalette,0x400);
    }
    else {
      iVar12 = 0x100 - iVar11;
      lVar8 = 0;
      do {
        uVar9 = (uint)GPalette.BaseColors[lVar8].field_0.field_0.b;
        uVar7 = (uint)GPalette.BaseColors[lVar8].field_0.field_0.r;
        uVar6 = (uint)GPalette.BaseColors[lVar8].field_0.field_0.g;
        iVar13 = (uVar9 * 0x25 + uVar6 * 0x8f + uVar7 * 0x4d >> 8) * iVar11;
        local_838[lVar8 + 0x100].field_0.field_0.r = (BYTE)(uVar7 * iVar12 + iVar13 >> 8);
        local_838[lVar8 + 0x100].field_0.field_0.g = (BYTE)(uVar6 * iVar12 + iVar13 >> 8);
        local_838[lVar8 + 0x100].field_0.field_0.b = (BYTE)(uVar9 * iVar12 + iVar13 >> 8);
        local_838[lVar8 + 0x100].field_0.field_0.a = '\0';
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x100);
    }
    local_850 = 0;
    lVar8 = 0;
    do {
      DoBlending(local_838 + 0x100,local_838,0x100,(uint)(this->Fade).field_0.field_0.r,
                 (uint)(this->Fade).field_0.field_0.g,(uint)(this->Fade).field_0.field_0.b,
                 (int)lVar8 * 8);
      pBVar4 = this->Maps;
      if ((this->Color).field_0.d == 0xffffff) {
        lVar10 = 0;
        do {
          BVar5 = FColorMatcher::Pick(&ColorMatcher,(uint)local_838[lVar10].field_0.field_0.r,
                                      (uint)local_838[lVar10].field_0.field_0.g,
                                      (uint)local_838[lVar10].field_0.field_0.b);
          pBVar4[lVar10 + local_850] = BVar5;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x100);
      }
      else {
        lVar10 = 0;
        do {
          BVar5 = FColorMatcher::Pick(&ColorMatcher,
                                      (uint)local_838[lVar10].field_0.field_0.r *
                                      (((uint)bVar1 * 0x100) / 0xff) >> 8,
                                      (uint)local_838[lVar10].field_0.field_0.g *
                                      (((uint)bVar2 * 0x100) / 0xff) >> 8,
                                      (uint)local_838[lVar10].field_0.field_0.b *
                                      (((uVar3 & 0xff) * 0x100) / 0xff) >> 8);
          pBVar4[lVar10 + local_850] = BVar5;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x100);
      }
      lVar8 = lVar8 + 1;
      local_850 = local_850 + 0x100;
    } while (lVar8 != 0x20);
  }
  return;
}

Assistant:

void FDynamicColormap::BuildLights ()
{
	int l, c;
	int lr, lg, lb, ld, ild;
	PalEntry colors[256], basecolors[256];
	BYTE *shade;

	if (Maps == NULL)
		return;

	// Scale light to the range 0-256, so we can avoid
	// dividing by 255 in the bottom loop.
	lr = Color.r*256/255;
	lg = Color.g*256/255;
	lb = Color.b*256/255;
	ld = Desaturate*256/255;
	if (ld < 0)	// No negative desaturations, please.
	{
		ld = -ld;
	}
	ild = 256-ld;

	if (ld == 0)
	{
		memcpy (basecolors, GPalette.BaseColors, sizeof(basecolors));
	}
	else
	{
		// Desaturate the palette before lighting it.
		for (c = 0; c < 256; c++)
		{
			int r = GPalette.BaseColors[c].r;
			int g = GPalette.BaseColors[c].g;
			int b = GPalette.BaseColors[c].b;
			int intensity = ((r * 77 + g * 143 + b * 37) >> 8) * ld;
			basecolors[c].r = (r*ild + intensity) >> 8;
			basecolors[c].g = (g*ild + intensity) >> 8;
			basecolors[c].b = (b*ild + intensity) >> 8;
			basecolors[c].a = 0;
		}
	}

	// build normal (but colored) light mappings
	for (l = 0; l < NUMCOLORMAPS; l++)
	{
		DoBlending (basecolors, colors, 256,
			Fade.r, Fade.g, Fade.b, l * (256 / NUMCOLORMAPS));

		shade = Maps + 256*l;
		if ((DWORD)Color == MAKERGB(255,255,255))
		{ // White light, so we can just pick the colors directly
			for (c = 0; c < 256; c++)
			{
				*shade++ = ColorMatcher.Pick (colors[c].r, colors[c].g, colors[c].b);
			}
		}
		else
		{ // Colored light, so do the (slightly) slower thing
			for (c = 0; c < 256; c++)
			{
				*shade++ = ColorMatcher.Pick (
					(colors[c].r*lr)>>8,
					(colors[c].g*lg)>>8,
					(colors[c].b*lb)>>8);
			}
		}
	}
}